

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void __thiscall GEO::Delaunay::Delaunay(Delaunay *this,coord_index_t dimension)

{
  index_t iVar1;
  
  (this->super_Counted).nb_refs_ = 0;
  (this->super_Counted)._vptr_Counted = (_func_int **)&PTR__Delaunay_001a8828;
  (this->v_to_cell_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
  super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->v_to_cell_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
  super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->v_to_cell_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
  super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->cicl_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
  super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->cicl_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
  super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->cicl_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
  super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  PackedArrays::PackedArrays(&this->neighbors_);
  (this->super_Counted).field_0xc = dimension;
  this->vertex_stride_ = (uint)dimension;
  iVar1 = dimension + 1;
  this->cell_size_ = iVar1;
  this->cell_v_stride_ = iVar1;
  this->cell_neigh_stride_ = iVar1;
  this->is_locked_ = false;
  this->store_neighbors_ = false;
  this->vertices_ = (double *)0x0;
  this->nb_vertices_ = 0;
  this->nb_cells_ = 0;
  this->cell_to_v_ = (signed_index_t *)0x0;
  this->cell_to_cell_ = (signed_index_t *)0x0;
  this->default_nb_neighbors_ = 0x1e;
  this->constraints_ = (Mesh *)0x0;
  this->do_reorder_ = true;
  this->refine_ = false;
  this->quality_ = 2.0;
  this->store_cicl_ = false;
  this->keep_infinite_ = false;
  this->nb_finite_cells_ = 0;
  this->keep_regions_ = false;
  return;
}

Assistant:

Delaunay::Delaunay(coord_index_t dimension) {
        set_dimension(dimension);
        vertices_ = nullptr;
        nb_vertices_ = 0;
        nb_cells_ = 0;
        cell_to_v_ = nullptr;
        cell_to_cell_ = nullptr;
        is_locked_ = false;
        store_neighbors_ = false;
        default_nb_neighbors_ = 30;
        constraints_ = nullptr;
        do_reorder_ = true;
        refine_ = false;
        quality_ = 2.0;
        store_cicl_ = false;
        keep_infinite_ = false;
        nb_finite_cells_ = 0;
	keep_regions_ = false;
    }